

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O3

void __thiscall QTimer::setInterval(QTimer *this,milliseconds interval)

{
  QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
  *this_00;
  QUntypedPropertyData *data;
  TimerId id;
  int iVar1;
  QObjectData *pQVar2;
  QBindingStatus *pQVar3;
  int iVar4;
  milliseconds mVar5;
  int iVar6;
  
  pQVar2 = (this->super_QObject).d_ptr.d;
  mVar5 = checkInterval("QTimer::setInterval",interval);
  this_00 = (QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
             *)((long)&pQVar2[1].children.d.size + 4);
  QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
  ::removeBindingUnlessInWrapper(this_00);
  id = (TimerId)pQVar2[1].children.d.size;
  iVar1 = *(int *)((long)&pQVar2[1].children.d.size + 4);
  iVar6 = (int)mVar5.__r;
  *(int *)((long)&pQVar2[1].children.d.size + 4) = iVar6;
  if (0 < (int)id) {
    QObject::killTimer(&this->super_QObject,id);
    data = (QUntypedPropertyData *)((long)&pQVar2[1].metaObject + 4);
    pQVar3 = (pQVar2->bindingStorage).bindingStatus;
    if ((pQVar3 != (QBindingStatus *)0x0) &&
       (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
      QBindingStorage::registerDependency_helper(&pQVar2->bindingStorage,data);
    }
    iVar4 = QObject::startTimer(&this->super_QObject,(nanoseconds)((long)iVar6 * 1000000),
                                *(TimerType *)data);
    if (iVar4 < 1) {
      *(undefined4 *)&pQVar2[1].children.d.size = 0;
      QObjectComputedProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_isActiveData_offset,_&QTimerPrivate::isActive>
      ::notify((QObjectComputedProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_isActiveData_offset,_&QTimerPrivate::isActive>
                *)&pQVar2[1].bindingStorage);
    }
    else {
      *(int *)&pQVar2[1].children.d.size = iVar4;
    }
  }
  if (iVar1 != iVar6) {
    QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
    ::notify(this_00);
    return;
  }
  return;
}

Assistant:

void QTimer::setInterval(std::chrono::milliseconds interval)
{
    Q_D(QTimer);

    interval = checkInterval("QTimer::setInterval", interval);
    const int msec = interval.count();
    d->inter.removeBindingUnlessInWrapper();
    const bool intervalChanged = msec != d->inter.valueBypassingBindings();
    d->inter.setValueBypassingBindings(msec);
    if (d->isActive()) { // create new timer
        QObject::killTimer(d->id);                        // restart timer
        Qt::TimerId newId{ QObject::startTimer(msec * 1ms, d->type) };  // overflow impossible
        if (newId > Qt::TimerId::Invalid) {
            // Restarted successfully. No need to update the active state.
            d->id = newId;
        } else {
            // Failed to start the timer.
            // Need to notify about active state change.
            d->id = Qt::TimerId::Invalid;
            d->isActiveData.notify();
        }
    }
    if (intervalChanged)
        d->inter.notify();
}